

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O1

void envy_bios_print_bit_d(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  envy_bios_bit_entry *peVar2;
  ulong uVar3;
  ulong uVar4;
  uint idx;
  ulong uVar5;
  char *name;
  char *local_38;
  
  peVar2 = (bios->d).bit;
  if ((mask >> 0x18 & 1) != 0 && peVar2 != (envy_bios_bit_entry *)0x0) {
    fprintf((FILE *)out,"BIT table \'d\' at 0x%x, version %i\n",(ulong)peVar2->offset,
            (ulong)peVar2->version);
    peVar2 = (bios->d).bit;
    if (peVar2->t_len != 0) {
      uVar4 = 0;
      idx = 0;
      do {
        uVar3 = (ulong)peVar2->t_offset;
        uVar5 = uVar3 + uVar4 + 1;
        if ((uint)uVar5 < bios->length) {
          uVar1 = CONCAT11(bios->data[uVar5 & 0xffffffff],bios->data[uVar4 + uVar3]);
          if (uVar1 != 0) {
            parse_at(bios,idx,&local_38);
            fprintf((FILE *)out,"0x%02x: 0x%x => d %s\n",uVar4 & 0xffffffff,(ulong)uVar1,local_38);
          }
        }
        else {
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar3 + uVar4);
        }
        idx = idx + 1;
        peVar2 = (bios->d).bit;
        uVar4 = uVar4 + 2;
      } while ((uint)uVar4 < (uint)peVar2->t_len);
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void
envy_bios_print_bit_d(struct envy_bios *bios, FILE *out, unsigned mask)
{
	struct envy_bios_d *d = &bios->d;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!d->bit || !(mask & ENVY_BIOS_PRINT_d))
		return;

	fprintf(out, "BIT table 'd' at 0x%x, version %i\n",
		d->bit->offset, d->bit->version);

	for (i = 0; i * 2 < d->bit->t_len; ++i) {
		ret = bios_u16(bios, d->bit->t_offset + (i * 2), &addr);
		if (!ret && addr) {
			const char *name;
			ret = parse_at(bios, i, &name);
			fprintf(out, "0x%02x: 0x%x => d %s\n", i * 2, addr, name);
		}
	}

	fprintf(out, "\n");
}